

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReceptiveFieldDecodingSynapse.cpp
# Opt level: O2

void __thiscall ReceptiveFieldDecodingSynapse::update(ReceptiveFieldDecodingSynapse *this)

{
  double dVar1;
  double dVar2;
  Population *pPVar3;
  Scalar *pSVar4;
  int j;
  long index;
  double dVar5;
  Scalar local_20;
  
  dVar1 = this->currentWindow;
  dVar2 = this->param->window_length_s;
  dVar5 = Clock::getCurrentTime(this->clock);
  if (dVar1 + dVar2 <= dVar5) {
    local_20 = -1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->spikeTimes,&local_20);
    this->currentWindow = this->param->window_length_s + this->currentWindow;
    this->earliestSpike = false;
  }
  for (index = 0;
      index < (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows; index = index + 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &this->spikeTimes,index);
    if (((*pSVar4 <= 0.0 && *pSVar4 != 0.0) &&
        ((((this->super_Synapse).from_population)->output).
         super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data.
         _M_start[index]->type == Spike)) && (this->earliestSpike == false)) {
      (*(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
        super__Vector_impl_data._M_start)[1]._vptr_Event =
           (_func_int **)((double)(int)index * this->outputStep);
      pPVar3 = (this->super_Synapse).to_population;
      (*pPVar3->_vptr_Population[5])(pPVar3,0);
      this->earliestSpike = true;
    }
  }
  Logging::logValue(this->logger,(long)this,0,3,
                    (double)(*(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>.
                              _M_impl.super__Vector_impl_data._M_start)[1]._vptr_Event);
  return;
}

Assistant:

void ReceptiveFieldDecodingSynapse::update() {
    if(currentWindow + param->window_length_s <= clock->getCurrentTime()) {
        spikeTimes.setConstant(-1);
        currentWindow += param->window_length_s;
        earliestSpike = false;
    }
    for(int j = 0; j < spikeTimes.size(); j++) {
        if(spikeTimes(j) < 0 && from_population->output[j]->type == EventType::Spike && !earliestSpike) {
            double outputValue = j * outputStep;
            static_cast<ValueEvent*>(output[0])->setValue(outputValue);
            to_population->setInput(0, output[0]);
            earliestSpike = true;
        }
    }
    logger->logValue((long)this, 0, EventType::Value, static_cast<ValueEvent*>(output[0])->value);
}